

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::SPxMainSM<double>::multiaggregation
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  double dVar1;
  int rowNumber;
  uint uVar2;
  uint uVar3;
  Item *pIVar4;
  Nonzero<double> *pNVar5;
  pointer pdVar6;
  SPxOut *pSVar7;
  bool bVar8;
  double dVar9;
  char cVar10;
  VectorBase<double> *pVVar11;
  SPxMainSM<double> *this_00;
  double dVar12;
  VectorBase<double> *pVVar13;
  MultiAggregationPS *this_01;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int *piVar19;
  ulong uVar20;
  Item *this_02;
  Item *pIVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  double dVar26;
  long in_FS_OFFSET;
  bool bVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double minVal;
  double minRes;
  double maxVal;
  double maxRes;
  VectorBase<double> upLocks;
  VectorBase<double> downLocks;
  double local_128;
  int local_120;
  uint local_11c;
  int local_118;
  int local_114;
  double local_110;
  SPxMainSM<double> *local_108;
  VectorBase<double> local_100;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  value_type local_c8;
  VectorBase<double> local_b8;
  VectorBase<double> local_a0;
  ulong local_88;
  int local_80;
  int local_7c;
  double local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  shared_ptr<soplex::Tolerances> local_50;
  bool *local_40;
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *local_38;
  
  local_7c = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_80 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_40 = again;
  VectorBase<double>::VectorBase(&local_b8,local_80);
  VectorBase<double>::VectorBase
            (&local_a0,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  uVar14 = (ulong)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if ((long)uVar14 < 1) {
    local_120 = 0;
    local_118 = 0;
    local_114 = 0;
  }
  else {
    local_78 = *(double *)(in_FS_OFFSET + -8);
    uStack_70 = 0;
    local_68._8_4_ = DAT_00601010._8_4_;
    local_68._0_8_ = (ulong)DAT_00601010 ^ (ulong)local_78;
    local_68._12_4_ = DAT_00601010._12_4_;
    local_38 = &this->m_hist;
    local_114 = 0;
    local_118 = 0;
    local_120 = 0;
    local_108 = this;
    do {
      uVar15 = uVar14 - 1;
      local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14 - 1] = 0.0;
      local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14 - 1] = 0.0;
      pIVar4 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar18 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar14 - 1].idx;
      uVar20 = uVar14;
      if (1 < pIVar4[iVar18].data.super_SVectorBase<double>.memused) {
        pIVar4 = pIVar4 + iVar18;
        local_88 = uVar14;
        if (0 < (pIVar4->data).super_SVectorBase<double>.memused) {
          lVar22 = 8;
          lVar25 = 0;
          do {
            pNVar5 = (pIVar4->data).super_SVectorBase<double>.m_elem;
            dVar26 = *(double *)((long)pNVar5 + lVar22 + -8);
            dVar1 = (lp->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[*(int *)((long)&pNVar5->val + lVar22)];
            ::soplex::infinity::__tls_init();
            pVVar13 = &local_a0;
            if ((dVar1 <= (double)local_68._0_8_) ||
               (dVar1 = (lp->super_LPRowSetBase<double>).right.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [*(int *)((long)&((pIVar4->data).super_SVectorBase<double>.m_elem)->val +
                                 lVar22)], ::soplex::infinity::__tls_init(), local_78 <= dVar1)) {
              dVar1 = (lp->super_LPRowSetBase<double>).left.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [*(int *)((long)&((pIVar4->data).super_SVectorBase<double>.m_elem)->val +
                               lVar22)];
              ::soplex::infinity::__tls_init();
              pVVar11 = &local_b8;
              if ((((double)local_68._0_8_ < dVar1) ||
                  (dVar1 = (lp->super_LPRowSetBase<double>).right.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [*(int *)((long)&((pIVar4->data).super_SVectorBase<double>.m_elem)->val +
                                    lVar22)], ::soplex::infinity::__tls_init(), pVVar11 = &local_a0,
                  pVVar13 = &local_b8, dVar1 < local_78)) &&
                 ((0.0 < dVar26 || (pVVar13 = pVVar11, dVar26 < 0.0)))) goto LAB_001f422a;
            }
            else {
              local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] =
                   local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15] + 1.0;
LAB_001f422a:
              pdVar6 = (pVVar13->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar6[uVar15] = pdVar6[uVar15] + 1.0;
            }
            lVar25 = lVar25 + 1;
            lVar22 = lVar22 + 0x10;
          } while (lVar25 < (pIVar4->data).super_SVectorBase<double>.memused);
        }
        if (((local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] == 1.0) &&
            (!NAN(local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15]))) ||
           ((uVar20 = local_88,
            local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] == 1.0 &&
            (!NAN(local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15]))))) {
          iVar18 = (int)uVar15;
          if ((pIVar4->data).super_SVectorBase<double>.memused < 1) {
            local_110 = (double)CONCAT44(local_110._4_4_,(int)CONCAT71((int7)((ulong)pIVar4 >> 8),1)
                                        );
            dVar26 = 2.12199579047121e-314;
          }
          else {
            pdVar6 = (lp->super_LPColSetBase<double>).low.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_d8 = pdVar6[uVar15];
            local_e0 = (lp->super_LPColSetBase<double>).up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15];
            local_11c = 0xffffffff;
            local_110 = (double)CONCAT44(local_110._4_4_,(int)CONCAT71((int7)((ulong)pdVar6 >> 8),1)
                                        );
            lVar25 = 0;
            lVar22 = 0;
            do {
              pNVar5 = (pIVar4->data).super_SVectorBase<double>.m_elem;
              local_d0 = *(double *)((long)&pNVar5->val + lVar25);
              rowNumber = *(int *)((long)&pNVar5->idx + lVar25);
              dVar26 = (lp->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[rowNumber];
              dVar1 = (lp->super_LPRowSetBase<double>).right.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[rowNumber];
              dVar9 = feastol(this);
              iVar23 = 10;
              if (dVar9 < ABS(dVar26 - dVar1)) {
                ::soplex::infinity::__tls_init();
                ::soplex::infinity::__tls_init();
                iVar23 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
                         [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                          [rowNumber].idx].data.super_SVectorBase<double>.memused;
                uVar28 = 0xffc00000;
                uVar29 = 0x41dfffff;
                if (2 < iVar23) {
                  uVar28 = 0;
                  uVar29 = 0x40080000;
                  if (iVar23 != 3) {
                    uVar28 = (undefined4)*(undefined8 *)(&DAT_006011b0 + (ulong)(iVar23 == 4) * 8);
                    uVar29 = (undefined4)
                             ((ulong)*(undefined8 *)(&DAT_006011b0 + (ulong)(iVar23 == 4) * 8) >>
                             0x20);
                  }
                }
                if (dVar26 <= (double)local_68._0_8_) {
LAB_001f4463:
                  bVar27 = false;
                }
                else {
                  dVar9 = *(double *)
                           ((long)&((pIVar4->data).super_SVectorBase<double>.m_elem)->val + lVar25);
                  if ((((dVar9 <= 0.0) ||
                       (0.0 < (lp->super_LPColSetBase<double>).object.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar15])) ||
                      (local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15] != 1.0)) ||
                     ((NAN(local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar15]) ||
                      (bVar27 = true,
                      (double)CONCAT44(uVar29,uVar28) <
                      local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar15])))) {
                    if (((0.0 <= dVar9) ||
                        (((lp->super_LPColSetBase<double>).object.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar15] < 0.0 ||
                         (local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar15] != 1.0)))) ||
                       (NAN(local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar15]))) goto LAB_001f4463;
                    bVar27 = local_a0.val.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar15] <=
                             (double)CONCAT44(uVar29,uVar28);
                  }
                }
                iVar23 = 0;
                bVar8 = false;
                if ((dVar1 < local_78) &&
                   ((((dVar9 = *(double *)
                                ((long)&((pIVar4->data).super_SVectorBase<double>.m_elem)->val +
                                lVar25), dVar9 <= 0.0 ||
                      ((lp->super_LPColSetBase<double>).object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15] < 0.0)) ||
                     (local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar15] != 1.0)) ||
                    ((NAN(local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar15]) ||
                     (bVar8 = true,
                     (double)CONCAT44(uVar29,uVar28) <
                     local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15])))))) {
                  if (((0.0 <= dVar9) ||
                      ((0.0 < (lp->super_LPColSetBase<double>).object.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar15] ||
                       (local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar15] != 1.0)))) ||
                     (NAN(local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar15]))) {
                    bVar8 = false;
                  }
                  else {
                    bVar8 = local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar15] <=
                            (double)CONCAT44(uVar29,uVar28);
                  }
                }
                this = local_108;
                if ((bool)(bVar27 | bVar8)) {
                  local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_c8.
                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  computeMinMaxResidualActivity
                            (local_108,lp,rowNumber,iVar18,(double *)&local_100,(double *)&local_c8)
                  ;
                  if (bVar27) {
                    computeMinMaxValues(local_108,lp,dVar26,local_d0,
                                        (double)local_100.val.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start,
                                        (double)local_c8.
                                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr,&local_128,&local_e8);
                    dVar26 = local_128;
                    ::soplex::infinity::__tls_init();
                    dVar9 = local_128;
                    iVar23 = 0;
                    bVar27 = true;
                    if (((((double)local_68._0_8_ < dVar26) &&
                         (dVar26 = feastol(local_108), dVar12 = local_e8, dVar26 < dVar9 - local_d8)
                         ) && (::soplex::infinity::__tls_init(), dVar26 = local_e8,
                              dVar12 < local_78)) &&
                       (dVar9 = feastol(local_108), dVar26 - local_e0 < -dVar9)) {
                      local_11c = *(uint *)((long)&((pIVar4->data).super_SVectorBase<double>.m_elem)
                                                   ->idx + lVar25);
                      iVar23 = 8;
                      local_110 = (double)CONCAT44(local_110._4_4_,
                                                   (int)CONCAT71((uint7)(uint3)(local_11c >> 8),1));
                      bVar27 = false;
                    }
                    this = local_108;
                    if (!bVar27) goto LAB_001f47a7;
                  }
                  this_00 = local_108;
                  iVar23 = 0;
                  this = local_108;
                  if (bVar8) {
                    computeMinMaxValues(local_108,lp,dVar1,local_d0,
                                        (double)local_100.val.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start,
                                        (double)local_c8.
                                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr,&local_128,&local_e8);
                    dVar26 = local_128;
                    ::soplex::infinity::__tls_init();
                    dVar1 = local_128;
                    iVar23 = 0;
                    this = local_108;
                    if ((((double)local_68._0_8_ < dVar26) &&
                        (dVar26 = feastol(this_00), dVar9 = local_e8, this = local_108,
                        dVar26 < dVar1 - local_d8)) &&
                       ((::soplex::infinity::__tls_init(), dVar26 = local_e8, this = local_108,
                        dVar9 < local_78 &&
                        (dVar1 = feastol(this_00), this = local_108, dVar26 - local_e0 < -dVar1))))
                    {
                      local_11c = *(uint *)((long)&((pIVar4->data).super_SVectorBase<double>.m_elem)
                                                   ->idx + lVar25);
                      iVar23 = 8;
                      local_110 = (double)((ulong)local_110 & 0xffffffff00000000);
                    }
                  }
                }
              }
LAB_001f47a7:
              if ((iVar23 != 10) && (iVar23 != 0)) break;
              lVar22 = lVar22 + 1;
              lVar25 = lVar25 + 0x10;
            } while (lVar22 < (pIVar4->data).super_SVectorBase<double>.memused);
            dVar26 = (double)(ulong)local_11c;
          }
          uVar24 = SUB84(dVar26,0);
          uVar20 = local_88;
          if (-1 < (int)uVar24) {
            this_02 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                      (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                      [(long)dVar26].idx;
            pVVar13 = &(lp->super_LPRowSetBase<double>).right;
            if (((ulong)local_110 & 1) != 0) {
              pVVar13 = &(lp->super_LPRowSetBase<double>).left;
            }
            local_110 = (pVVar13->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)dVar26];
            dVar1 = SVectorBase<double>::operator[]((SVectorBase<double> *)this_02,iVar18);
            this_01 = (MultiAggregationPS *)operator_new(0xa0);
            local_50.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (this->super_SPxSimplifier<double>)._tolerances.
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_50.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (this->super_SPxSimplifier<double>)._tolerances.
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
            if (local_50.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_50.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_50.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_50.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_50.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_e0 = dVar26;
            MultiAggregationPS::MultiAggregationPS
                      (this_01,lp,this,uVar24,iVar18,local_110,&local_50);
            local_c8.
            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)this_01;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<soplex::SPxMainSM<double>::MultiAggregationPS*>
                      (&local_c8.
                        super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,this_01);
            if (local_50.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_50.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            local_11c = uVar24;
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
            ::push_back(&local_38->data,&local_c8);
            if (0 < (pIVar4->data).super_SVectorBase<double>.memused) {
              lVar22 = 0;
              do {
                uVar24 = (pIVar4->data).super_SVectorBase<double>.m_elem[lVar22].idx;
                if (uVar24 != local_11c) {
                  VectorBase<double>::VectorBase
                            (&local_100,
                             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
                  pdVar6 = local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  iVar18 = (pIVar4->data).super_SVectorBase<double>.m_elem[lVar22].idx;
                  dVar26 = (lp->super_LPRowSetBase<double>).right.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar18];
                  pIVar21 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                            (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                            [iVar18].idx;
                  local_d0 = (lp->super_LPRowSetBase<double>).left.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar18];
                  if (local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    memset(local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start,0,
                           (long)local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start & 0xfffffffffffffff8);
                  }
                  this = local_108;
                  lVar25 = (long)(pIVar21->data).super_SVectorBase<double>.memused;
                  if (0 < lVar25) {
                    pNVar5 = (pIVar21->data).super_SVectorBase<double>.m_elem;
                    lVar17 = 0;
                    do {
                      pdVar6[*(int *)((long)&pNVar5->idx + lVar17)] =
                           *(double *)((long)&pNVar5->val + lVar17);
                      lVar17 = lVar17 + 0x10;
                    } while (lVar25 * 0x10 != lVar17);
                  }
                  if (0 < (this_02->data).super_SVectorBase<double>.memused) {
                    lVar25 = 0;
                    do {
                      uVar2 = (this_02->data).super_SVectorBase<double>.m_elem[lVar25].idx;
                      uVar14 = (ulong)uVar2;
                      if (uVar15 != uVar14) {
                        pIVar21 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                  theitem;
                        iVar18 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                                 [(int)uVar24].idx;
                        pNVar5 = pIVar21[iVar18].data.super_SVectorBase<double>.m_elem;
                        if ((pNVar5 == (Nonzero<double> *)0x0) ||
                           (uVar20 = (ulong)pIVar21[iVar18].data.super_SVectorBase<double>.memused,
                           (long)uVar20 < 1)) {
LAB_001f4a5f:
                          iVar18 = -1;
                        }
                        else {
                          if (pNVar5->idx == uVar2) {
                            bVar27 = true;
                            uVar16 = 0;
                          }
                          else {
                            uVar16 = 0;
                            piVar19 = &pNVar5[1].idx;
                            do {
                              if (uVar20 - 1 == uVar16) goto LAB_001f4a5f;
                              uVar16 = uVar16 + 1;
                              uVar3 = *piVar19;
                              piVar19 = piVar19 + 4;
                            } while (uVar3 != uVar2);
                            bVar27 = uVar16 < uVar20;
                          }
                          iVar18 = (int)uVar16;
                          if (!bVar27) goto LAB_001f4a5f;
                        }
                        if (iVar18 < 0) {
                          local_128 = (-local_100.val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[uVar15] *
                                      (this_02->data).super_SVectorBase<double>.m_elem[lVar25].val)
                                      / dVar1;
                          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                                    (lp,(ulong)uVar24,uVar14,&local_128,0);
                        }
                        else {
                          pNVar5 = (this_02->data).super_SVectorBase<double>.m_elem;
                          local_128 = local_100.val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[pNVar5[lVar25].idx] -
                                      (local_100.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar15] * pNVar5[lVar25].val
                                      ) / dVar1;
                          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                                    (lp,(ulong)uVar24,uVar14,&local_128);
                        }
                      }
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < (this_02->data).super_SVectorBase<double>.memused);
                  }
                  local_d8 = (lp->super_LPRowSetBase<double>).right.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar24];
                  ::soplex::infinity::__tls_init();
                  if (local_d8 < local_78) {
                    local_128 = dVar26 - (local_100.val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar15] *
                                         local_110) / dVar1;
                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
                              (lp,(ulong)uVar24,&local_128,0);
                  }
                  dVar26 = (lp->super_LPRowSetBase<double>).left.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)uVar24];
                  ::soplex::infinity::__tls_init();
                  if ((double)local_68._0_8_ < dVar26) {
                    local_128 = local_d0 -
                                (local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar15] * local_110) /
                                dVar1;
                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
                              (lp,(ulong)uVar24,&local_128,0);
                  }
                  if (local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_100.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_100.val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_100.val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 < (pIVar4->data).super_SVectorBase<double>.memused);
            }
            if (0 < (this_02->data).super_SVectorBase<double>.memused) {
              lVar22 = 8;
              lVar25 = 0;
              do {
                uVar14 = (ulong)*(uint *)((long)&((this_02->data).super_SVectorBase<double>.m_elem)
                                                 ->val + lVar22);
                if (uVar15 != uVar14) {
                  pNVar5 = (this_02->data).super_SVectorBase<double>.m_elem;
                  pdVar6 = (lp->super_LPColSetBase<double>).object.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)(pdVar6[*(int *)((long)&pNVar5->val + lVar22)] -
                                (pdVar6[uVar15] * *(double *)((long)pNVar5 + lVar22 + -8)) / dVar1);
                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x27])
                            (lp,uVar14,&local_100,0);
                }
                lVar25 = lVar25 + 1;
                lVar22 = lVar22 + 0x10;
              } while (lVar25 < (this_02->data).super_SVectorBase<double>.memused);
            }
            local_120 = local_120 +
                        (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
                        [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar15]
                         .idx].data.super_SVectorBase<double>.memused;
            piVar19 = (this->m_cIdx).data;
            piVar19[uVar15] =
                 piVar19[(long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum +
                         -1];
            (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x15])
                      (lp,uVar15 & 0xffffffff);
            iVar18 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
                     [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                      [(long)local_e0].idx].data.super_SVectorBase<double>.memused;
            piVar19 = (this->m_rIdx).data;
            piVar19[(long)local_e0] =
                 piVar19[(long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum +
                         -1];
            (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xf])(lp,(ulong)local_11c)
            ;
            uVar20 = local_88;
            piVar19 = (this->m_stat).data + 0x10;
            *piVar19 = *piVar19 + 1;
            if (local_c8.
                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8.
                         super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            local_118 = local_118 + 1;
            local_114 = local_114 + 1;
            local_120 = local_120 + iVar18;
          }
        }
      }
      uVar14 = uVar15;
    } while (1 < (long)uVar20);
  }
  iVar18 = local_114 + local_118;
  if (iVar18 != 0 && SCARRY4(local_114,local_118) == iVar18 < 0) {
    piVar19 = &(this->super_SPxSimplifier<double>).m_remRows;
    *piVar19 = *piVar19 + local_114;
    piVar19 = &(this->super_SPxSimplifier<double>).m_remCols;
    *piVar19 = *piVar19 + local_118;
    piVar19 = &(this->super_SPxSimplifier<double>).m_remNzos;
    *piVar19 = *piVar19 + local_120;
    pSVar7 = (this->super_SPxSimplifier<double>).spxout;
    if ((pSVar7 != (SPxOut *)0x0) && (3 < (int)pSVar7->m_verbosity)) {
      local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,pSVar7->m_verbosity);
      local_c8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               CONCAT44(local_c8.
                        super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._4_4_,4);
      (*pSVar7->_vptr_SPxOut[2])();
      pSVar7 = (this->super_SPxSimplifier<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar7->m_streams[pSVar7->m_verbosity],"Simplifier (multi-aggregation) removed ",
                 0x27);
      std::ostream::operator<<((ostream *)pSVar7->m_streams[pSVar7->m_verbosity],local_114);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar7->m_streams[pSVar7->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar7->m_streams[pSVar7->m_verbosity],local_118);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar7->m_streams[pSVar7->m_verbosity]," cols, ",7);
      std::ostream::operator<<((ostream *)pSVar7->m_streams[pSVar7->m_verbosity],local_120);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar7->m_streams[pSVar7->m_verbosity]," non-zeros",10);
      cVar10 = (char)pSVar7->m_streams[pSVar7->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar7->m_streams[pSVar7->m_verbosity] + -0x18)
                      + cVar10);
      std::ostream::put(cVar10);
      std::ostream::flush();
      pSVar7 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar7->_vptr_SPxOut[2])(pSVar7,&local_100);
    }
    if ((double)(local_80 + local_7c) * (this->super_SPxSimplifier<double>).m_minReduction <
        (double)iVar18) {
      *local_40 = true;
    }
  }
  if (local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::multiaggregation(SPxLPBase<R>& lp, bool& again)
{
   // this simplifier eliminates rows and columns by performing multi aggregations as identified by the constraint
   // activities.
   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   VectorBase<R> upLocks(lp.nCols());
   VectorBase<R> downLocks(lp.nCols());

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      // setting the locks on the variables
      upLocks[j] = 0;
      downLocks[j] = 0;

      if(lp.colVector(j).size() <= 1)
         continue;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(lp.lhs(col.index(k)) > R(-infinity) && lp.rhs(col.index(k)) < R(infinity))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(lp.lhs(col.index(k)) > R(-infinity))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(lp.rhs(col.index(k)) < R(infinity))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      // multi-aggregate column
      if(upLocks[j] == 1 || downLocks[j] == 1)
      {
         R lower = lp.lower(j);
         R upper = lp.upper(j);
         int maxOtherLocks;
         int bestpos = -1;
         bool bestislhs = true;

         for(int k = 0; k < col.size(); ++k)
         {
            int rowNumber;
            R lhs;
            R rhs;
            bool lhsExists;
            bool rhsExists;
            bool aggLhs;
            bool aggRhs;

            R val = col.value(k);

            rowNumber = col.index(k);
            lhs = lp.lhs(rowNumber);
            rhs = lp.rhs(rowNumber);

            if(EQ(lhs, rhs, feastol()))
               continue;

            lhsExists = lhs > R(-infinity);
            rhsExists = rhs < R(infinity);

            if(lp.rowVector(rowNumber).size() <= 2)
               maxOtherLocks = INT_MAX;
            else if(lp.rowVector(rowNumber).size() == 3)
               maxOtherLocks = 3;
            else if(lp.rowVector(rowNumber).size() == 4)
               maxOtherLocks = 2;
            else
               maxOtherLocks = 1;

            aggLhs = lhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks));
            aggRhs = rhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks));

            if(aggLhs || aggRhs)
            {
               R minRes = 0;   // this is the minimum value that the aggregation can attain
               R maxRes = 0;   // this is the maximum value that the aggregation can attain

               // computing the minimum and maximum residuals if variable j is set to zero.
               computeMinMaxResidualActivity(lp, rowNumber, j, minRes, maxRes);

               // we will try to aggregate to the lhs
               if(aggLhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, lhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  // if the bounds of the aggregation and the original variable are equivalent, then we can reduce
                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = true;
                     break;
                  }
               }

               // we will try to aggregate to the rhs
               if(aggRhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, rhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = false;
                     break;
                  }
               }
            }
         }

         // it is only possible to aggregate if a best position has been found
         if(bestpos >= 0)
         {
            const SVectorBase<R>& bestRow = lp.rowVector(bestpos);
            // aggregating the variable and applying the fixings to the all other constraints
            R aggConstant = (bestislhs ? lp.lhs(bestpos) : lp.rhs(
                                bestpos));   // this is the lhs or rhs of the aggregated row
            R aggAij =
               bestRow[j];                                   // this is the coefficient of the deleted col

            SPxOut::debug(this,
                          "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n",
                          j, bestpos, aggConstant, aggAij);

            std::shared_ptr<PostStep> ptr(new MultiAggregationPS(lp, *this, bestpos, j,
                                          aggConstant, this->_tolerances));
            m_hist.append(ptr);

            for(int k = 0; k < col.size(); ++k)
            {
               if(col.index(k) != bestpos)
               {
                  int rowNumber = col.index(k);
                  VectorBase<R> updateRow(lp.nCols());
                  R updateRhs = lp.rhs(col.index(k));
                  R updateLhs = lp.lhs(col.index(k));

                  updateRow = lp.rowVector(col.index(k));

                  // updating the row with the best row
                  for(int l = 0; l < bestRow.size(); l++)
                  {
                     if(bestRow.index(l) != j)
                     {
                        if(lp.rowVector(rowNumber).pos(bestRow.index(l)) >= 0)
                           lp.changeElement(rowNumber, bestRow.index(l), updateRow[bestRow.index(l)]
                                            - updateRow[j]*bestRow.value(l) / aggAij);
                        else
                           lp.changeElement(rowNumber, bestRow.index(l), -1.0 * updateRow[j]*bestRow.value(l) / aggAij);
                     }
                  }

                  // NOTE: I don't know whether we should change the LHS and RHS if they are currently at R(infinity)
                  if(lp.rhs(rowNumber) < R(infinity))
                     lp.changeRhs(rowNumber, updateRhs - updateRow[j]*aggConstant / aggAij);

                  if(lp.lhs(rowNumber) > R(-infinity))
                     lp.changeLhs(rowNumber, updateLhs - updateRow[j]*aggConstant / aggAij);

                  assert(LE(lp.lhs(rowNumber), lp.rhs(rowNumber), this->tolerances()->epsilon()));
               }
            }

            for(int l = 0; l < bestRow.size(); l++)
            {
               if(bestRow.index(l) != j)
                  lp.changeMaxObj(bestRow.index(l),
                                  lp.maxObj(bestRow.index(l)) - lp.maxObj(j)*bestRow.value(l) / aggAij);
            }

            ++remCols;
            remNzos += lp.colVector(j).size();
            removeCol(lp, j);
            ++remRows;
            remNzos += lp.rowVector(bestpos).size();
            removeRow(lp, bestpos);

            ++m_stat[MULTI_AGG];
         }
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (multi-aggregation) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}